

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9_hashmap_copy(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pVal;
  jx9_value *pSrc;
  
  if ((0 < nArg) && (pSrc = jx9_context_new_array(pCtx), pSrc != (jx9_value *)0x0)) {
    pVal = *apArg;
    if ((pVal->iFlags & 0x40) == 0) {
      HashmapInsert((jx9_hashmap *)(pSrc->x).pOther,(jx9_value *)0x0,pVal);
    }
    else {
      jx9HashmapDup((jx9_hashmap *)(pVal->x).pOther,(jx9_hashmap *)(pSrc->x).pOther);
    }
    jx9MemObjStore(pSrc,pCtx->pRet);
    return 0;
  }
  jx9MemObjRelease(pCtx->pRet);
  return 0;
}

Assistant:

static int jx9_hashmap_copy(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_hashmap *pMap;
	jx9_value *pArray;
	if( nArg < 1 ){
		/* Missing arguments, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Create a new array */
	pArray = jx9_context_new_array(pCtx);
	if( pArray == 0 ){
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Point to the internal representation of the hashmap */
	pMap = (jx9_hashmap *)pArray->x.pOther;
	if( jx9_value_is_json_array(apArg[0])){
		/* Point to the internal representation of the source */
		jx9_hashmap *pSrc = (jx9_hashmap *)apArg[0]->x.pOther;
		/* Perform the copy */
		jx9HashmapDup(pSrc, pMap);
	}else{
		/* Simple insertion */
		jx9HashmapInsert(pMap, 0/* Automatic index assign*/, apArg[0]); 
	}
	/* Return the duplicated array */
	jx9_result_value(pCtx, pArray);
	return JX9_OK;
}